

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c003::TestCheckArrayEqualTrue::RunImpl(TestCheckArrayEqualTrue *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_90;
  int local_6c [5];
  TestDetails local_58;
  int local_34 [2];
  int array [3];
  TestResults results;
  TestCheckArrayEqualTrue *this_local;
  
  UnitTest::TestResults::TestResults((TestResults *)(array + 1),(TestReporter *)0x0);
  local_34[0] = 1;
  local_34[1] = 2;
  array[0] = 3;
  UnitTest::TestDetails::TestDetails(&local_58,"","","",0);
  UnitTest::CheckArrayEqual<int[3],int[3]>
            ((TestResults *)(array + 1),(int (*) [3])local_34,(int (*) [3])local_34,3,&local_58);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_6c[1] = 0;
  local_6c[0] = UnitTest::TestResults::GetFailureCount((TestResults *)(array + 1));
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_90,*ppTVar2,0xbe);
  UnitTest::CheckEqual<int,int>(results_00,local_6c + 1,local_6c,&local_90);
  return;
}

Assistant:

TEST(CheckArrayEqualTrue)
{
    TestResults results;

    int const array[3] = { 1, 2, 3 };
    CheckArrayEqual(results, array, array, 3, TestDetails("", "", "", 0));
    CHECK_EQUAL(0, results.GetFailureCount());
}